

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O3

void module_load_cold_1(void)

{
  fprintf(_stderr,"%s:%d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/modules/module_file_server.cpp"
          ,0x3a);
  fprintf(_stderr,"--> %s\n","false");
  perror("info");
  exit(1);
}

Assistant:

static std::list<std::string> recursive_list_files(std::string path) {
    std::list<std::string> result;
    std::list<std::string> todo;
    std::string s;
    todo.push_back(path);

    DIR *dir;
    struct dirent *ent;

    while (todo.size() > 0) {
        auto item = todo.back();
        todo.pop_back();
        if ((dir = opendir(item.c_str())) != NULL) {
            while ((ent = readdir(dir)) != NULL) {
                s = ent->d_name;
                if (s == "." || s == ".." || s[0] == '.') continue;
                switch (ent->d_type) {
                    case DT_REG:
                        // is regular file
                        result.push_back(item + "/" + s);
                        break;
                    case DT_DIR:
                        // is directory
                        todo.push_back(item + "/" + s);
                        break;
                    default: IF_FALSE_EXIT(false);
                }
            }
            closedir(dir);
        }
    }
    return result;
}